

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testIntArrayProperty_Test::~MaterialSystemTest_testIntArrayProperty_Test
          (MaterialSystemTest_testIntArrayProperty_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testIntArrayProperty)
{
    int pf[] = {0,1,2,3};
    unsigned int pMax = sizeof(pf) / sizeof(int);
    this->pcMat->AddProperty(pf,pMax,"testKey4");
    pf[0] = pf[1] = pf[2] = pf[3] = 12;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey4",0,0,pf,&pMax));
    EXPECT_EQ(sizeof(pf) / sizeof(int), pMax);
    EXPECT_TRUE(!pf[0] && 1 == pf[1] && 2 == pf[2] && 3 == pf[3] );
}